

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O0

void __thiscall ZXing::BitMatrix::setRegion(BitMatrix *this,int left,int top,int width,int height)

{
  int iVar1;
  invalid_argument *piVar2;
  reference pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  int x;
  int offset;
  int y;
  int bottom;
  int right;
  int local_38;
  int local_30;
  
  if ((in_EDX < 0) || (in_ESI < 0)) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar2,"BitMatrix::setRegion(): Left and top must be nonnegative");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((0 < in_R8D) && (0 < in_ECX)) {
    if ((in_EDX + in_R8D <= in_RDI[1]) && (local_30 = in_EDX, in_ESI + in_ECX <= *in_RDI)) {
      for (; local_30 < in_EDX + in_R8D; local_30 = local_30 + 1) {
        iVar1 = *in_RDI;
        for (local_38 = in_ESI; local_38 < in_ESI + in_ECX; local_38 = local_38 + 1) {
          pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2),
                              (long)(local_30 * iVar1 + local_38));
          *pvVar3 = 0xff;
        }
      }
      return;
    }
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar2,"BitMatrix::setRegion(): The region must fit inside the matrix");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar2,"BitMatrix::setRegion(): Height and width must be at least 1");
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
BitMatrix::setRegion(int left, int top, int width, int height)
{
	if (top < 0 || left < 0) {
		throw std::invalid_argument("BitMatrix::setRegion(): Left and top must be nonnegative");
	}
	if (height < 1 || width < 1) {
		throw std::invalid_argument("BitMatrix::setRegion(): Height and width must be at least 1");
	}
	int right = left + width;
	int bottom = top + height;
	if (bottom > _height || right > _width) {
		throw std::invalid_argument("BitMatrix::setRegion(): The region must fit inside the matrix");
	}
	for (int y = top; y < bottom; y++) {
		auto offset = y * _width;
		for (int x = left; x < right; x++) {
			_bits[offset + x] = SET_V;
		}
	}
}